

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_sparse.hpp
# Opt level: O0

unsigned_long *
boost::numeric::ublas::detail::lower_bound<unsigned_long*,unsigned_long,std::less<unsigned_long>>
          (long *param_1,long *param_2,unsigned_long *param_3)

{
  bool bVar1;
  unsigned_long *puVar2;
  less<unsigned_long> local_9 [9];
  
  if ((*param_1 != *param_2) &&
     (bVar1 = std::less<unsigned_long>::operator()(local_9,(unsigned_long *)*param_1,param_3), bVar1
     )) {
    bVar1 = std::less<unsigned_long>::operator()(local_9,(unsigned_long *)(*param_2 + -8),param_3);
    if (!bVar1) {
      puVar2 = std::lower_bound<unsigned_long*,unsigned_long,std::less<unsigned_long>>
                         (*param_1,*param_2,param_3);
      return puVar2;
    }
    return (unsigned_long *)*param_2;
  }
  return (unsigned_long *)*param_1;
}

Assistant:

BOOST_UBLAS_INLINE
        I lower_bound (const I &begin, const I &end, const T &t, C compare) {
            // t <= *begin <=> ! (*begin < t)
            if (begin == end || ! compare (*begin, t))
                return begin;
            if (compare (*(end - 1), t))
                return end;
            return std::lower_bound (begin, end, t, compare);
        }